

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O0

int nva_rsdefsz(nva_regspace *regspace)

{
  nva_regspace_type nVar1;
  nva_regspace *regspace_local;
  
  nVar1 = regspace->type;
  if ((NVA_REGSPACE_IOBAR < nVar1) && (4 < nVar1 - NVA_REGSPACE_DPRAM)) {
    if (nVar1 == NVA_REGSPACE_VCOMP_REG) {
      return 8;
    }
    if (nVar1 != NVA_REGSPACE_MACRO_CODE && nVar1 != NVA_REGSPACE_XT) {
      return 1;
    }
  }
  return 4;
}

Assistant:

int nva_rsdefsz(struct nva_regspace *regspace) {
	switch (regspace->type) {
		case NVA_REGSPACE_BAR0:
		case NVA_REGSPACE_BAR1:
		case NVA_REGSPACE_BAR2:
		case NVA_REGSPACE_IOBAR:
		case NVA_REGSPACE_DPRAM:
		case NVA_REGSPACE_PIPE:
		case NVA_REGSPACE_RDI:
		case NVA_REGSPACE_RDIB:
		case NVA_REGSPACE_VCOMP_CODE:
		case NVA_REGSPACE_MACRO_CODE:
		case NVA_REGSPACE_XT:
			return 4;
		case NVA_REGSPACE_VCOMP_REG:
			return 8;
		default:
			return 1;
	}
}